

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

double __thiscall
ParserProbModelXML::QueryADD
          (ParserProbModelXML *this,xmlNodePtr root_node,xmlNodePtr current_node,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  xmlNodePtr pxVar4;
  undefined8 uVar5;
  pointer ppVar6;
  reference this_00;
  reference pvVar7;
  xmlNodePtr pxVar8;
  long lVar9;
  xmlDocPtr pxVar10;
  xmlXPathObjectPtr pxVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__rhs;
  xmlNodePtr in_RCX;
  xmlNodePtr in_RDX;
  ParserProbModelXML *in_RSI;
  ParserProbModelXML *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_R8;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  int dep_var_time;
  string dep_var_name;
  xmlNodePtr dep_var;
  const_iterator it_1;
  string CPD_type;
  xmlNodePtr potential;
  xmlXPathObjectPtr label_nodes;
  string xpath_str;
  string ref_name;
  xmlNodePtr reference;
  string var_name;
  xmlNodePtr var_state;
  xmlNodePtr states;
  bool found_branch;
  xmlNodePtr branch;
  xmlNodePtr branch_set;
  string value_name;
  pair<ParserProbModelXML::elm_type,_unsigned_int> elm;
  Index value;
  const_iterator it;
  int timeslice;
  string top_name;
  xmlNodePtr top;
  NamedDescribedEntity *in_stack_fffffffffffff7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c0;
  xmlNodePtr in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7d0;
  ParserProbModelXML *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  allocator<char> *in_stack_fffffffffffff7f0;
  allocator<char> *__a;
  string *in_stack_fffffffffffff7f8;
  xmlNodePtr in_stack_fffffffffffff800;
  ParserProbModelXML *in_stack_fffffffffffff808;
  ParserProbModelXML *this_01;
  xmlNodePtr in_stack_fffffffffffff830;
  ParserProbModelXML *in_stack_fffffffffffff838;
  byte local_739;
  byte local_709;
  string local_5a8 [39];
  allocator<char> local_581;
  string local_580 [39];
  undefined1 local_559 [33];
  xmlNodePtr local_538;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
  local_530 [13];
  undefined4 local_4c4;
  allocator<char> local_459;
  string local_458 [39];
  allocator<char> local_431;
  string local_430 [32];
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  xmlNodePtr in_stack_fffffffffffffc00;
  ParserProbModelXML *in_stack_fffffffffffffc08;
  string local_370 [32];
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [39];
  allocator<char> local_301;
  string local_300 [32];
  xmlNodePtr local_2e0;
  string local_2d8 [32];
  long local_2b8;
  allocator<char> local_2a9;
  string local_2a8 [32];
  xmlNodePtr local_288;
  byte local_279;
  _xmlNode *local_278;
  allocator<char> local_269;
  string local_268 [32];
  xmlNodePtr local_248;
  undefined1 local_239;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  pair<ParserProbModelXML::elm_type,_unsigned_int> local_158;
  uint local_150;
  undefined1 local_149;
  _Self local_108;
  _Base_ptr local_100;
  undefined1 local_f1;
  _Self local_b0;
  _Base_ptr local_a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
  local_a0;
  int local_94;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  double local_8;
  undefined1 extraout_var [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  pxVar4 = FindChild((ParserProbModelXML *)
                     CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                     (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  if (pxVar4 == (xmlNodePtr)0x0) {
    uVar5 = __cxa_allocate_exception(0x28);
    EParse::EParse((EParse *)in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8);
    __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
  }
  GetVariableName_abi_cxx11_(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  local_94 = GetVariableTimeslice(in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
  ::_Rb_tree_const_iterator(&local_a0);
  if (local_94 == 0) {
    local_a8 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                       *)in_stack_fffffffffffff7b8,(key_type *)0xa86c7b);
    local_a0._M_node = local_a8;
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)in_stack_fffffffffffff7b8);
    bVar1 = std::operator==(&local_a0,&local_b0);
    if (bVar1) {
      local_f1 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::operator+((char *)in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
      EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      local_f1 = 0;
      __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
    }
  }
  else {
    local_100 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                        *)in_stack_fffffffffffff7b8,(key_type *)0xa86e18);
    local_a0._M_node = local_100;
    local_108._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                *)in_stack_fffffffffffff7b8);
    bVar1 = std::operator==(&local_a0,&local_108);
    if (bVar1) {
      local_149 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::operator+((char *)in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
      EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      local_149 = 0;
      __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
    }
  }
  ppVar6 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                         *)0xa86f91);
  local_150 = (ppVar6->second).first;
  std::__cxx11::string::string(local_178,local_90);
  local_158 = GetParsedElement(in_stack_fffffffffffff838,(string *)in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::string(local_198);
  if (local_158.first == STATE) {
    (**(code **)(*(long *)&(in_RDI->_m_fDecPOMDP->
                           super_MultiAgentDecisionProcessDiscreteFactoredStates).
                           super_MultiAgentDecisionProcess + 200))
              (in_RDI->_m_fDecPOMDP,local_158.second);
    StateFactorDiscrete::GetStateFactorValue_abi_cxx11_
              ((StateFactorDiscrete *)in_stack_fffffffffffff7c8,
               (Index)((ulong)in_stack_fffffffffffff7c0 >> 0x20));
    std::__cxx11::string::operator=(local_198,local_1b8);
    std::__cxx11::string::~string(local_1b8);
  }
  else if (local_158.first == ACTION) {
    if ((in_RDI->_m_asynchronousModel & 1U) == 0) {
      (**(code **)(*(long *)&(in_RDI->_m_fDecPOMDP->
                             super_MultiAgentDecisionProcessDiscreteFactoredStates).
                             super_MultiAgentDecisionProcess + 0x120))
                (in_RDI->_m_fDecPOMDP,local_158.second,local_150);
      NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffff7b8);
      std::__cxx11::string::operator=(local_198,local_1d8);
      std::__cxx11::string::~string(local_1d8);
    }
    else {
      this_00 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&in_RDI->_m_ANames,(ulong)local_158.second);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(ulong)local_150);
      std::__cxx11::string::operator=(local_198,(string *)pvVar7);
    }
  }
  else {
    if (local_158.first != OBSERVATION) {
      local_239 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::operator+((char *)in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
      EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      local_239 = 0;
      __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
    }
    (**(code **)(*(long *)&(in_RDI->_m_fDecPOMDP->
                           super_MultiAgentDecisionProcessDiscreteFactoredStates).
                           super_MultiAgentDecisionProcess + 0x178))
              (in_RDI->_m_fDecPOMDP,local_158.second,local_150);
    NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffff7b8);
    std::__cxx11::string::operator=(local_198,local_1f8);
    std::__cxx11::string::~string(local_1f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  pxVar8 = FindChild((ParserProbModelXML *)
                     CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                     (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  local_248 = pxVar8;
  if (pxVar8 == (xmlNodePtr)0x0) {
    uVar5 = __cxa_allocate_exception(0x28);
    EParse::EParse((EParse *)in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8);
    __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
  }
  local_278 = (_xmlNode *)xmlFirstElementChild(pxVar8);
  local_279 = 0;
  do {
    local_709 = 0;
    if (local_278 != (_xmlNode *)0x0) {
      local_709 = local_279 ^ 0xff;
    }
    if ((local_709 & 1) == 0) {
      __rhs = (char *)__cxa_allocate_exception(0x28);
      std::operator+((char *)in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7c8,__rhs);
      EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      __cxa_throw(__rhs,&EParse::typeinfo,EParse::~EParse);
    }
    if (local_278->type == XML_ELEMENT_NODE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                 in_stack_fffffffffffff7f0);
      pxVar8 = FindChild((ParserProbModelXML *)
                         CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                         (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      local_288 = pxVar8;
      lVar9 = xmlChildElementCount(pxVar8);
      if (lVar9 == 0) {
        local_279 = 1;
      }
      else {
        local_2b8 = xmlFirstElementChild(local_288);
        while( true ) {
          local_739 = 0;
          if (local_2b8 != 0) {
            local_739 = local_279 ^ 0xff;
          }
          if ((local_739 & 1) == 0) break;
          if (*(int *)(local_2b8 + 8) == 1) {
            GetVariableName_abi_cxx11_(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0)
                                    ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff7d8);
            if (_Var2) {
              local_279 = 1;
            }
            std::__cxx11::string::~string(local_2d8);
          }
          local_2b8 = *(long *)(local_2b8 + 0x30);
        }
      }
      if ((local_279 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                   in_stack_fffffffffffff7f0);
        pxVar8 = FindChild((ParserProbModelXML *)
                           CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                           (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
        std::__cxx11::string::~string(local_300);
        std::allocator<char>::~allocator(&local_301);
        local_2e0 = pxVar8;
        if (pxVar8 != (xmlNodePtr)0x0) {
          pxVar10 = GetDoc(in_RDI);
          xmlNodeListGetString(pxVar10,local_2e0->children,1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                     in_stack_fffffffffffff7f0);
          std::allocator<char>::~allocator(&local_329);
          std::operator+((char *)in_stack_fffffffffffff808,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff800);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
          std::__cxx11::string::~string(local_370);
          std::__cxx11::string::c_str();
          pxVar11 = GetNodesMatchingExpression
                              (in_stack_fffffffffffff7d8,(xmlChar *)in_stack_fffffffffffff7d0,
                               in_stack_fffffffffffff7c8);
          if (pxVar11 == (xmlXPathObjectPtr)0x0) {
            uVar5 = __cxa_allocate_exception(0x28);
            std::operator+((char *)in_stack_fffffffffffff808,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff800);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
            EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
            __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
          }
          if (1 < pxVar11->nodesetval->nodeNr) {
            uVar5 = __cxa_allocate_exception(0x28);
            std::operator+((char *)in_stack_fffffffffffff808,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff800);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
            EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
            __cxa_throw(uVar5,&EParse::typeinfo,EParse::~EParse);
          }
          local_278 = (*pxVar11->nodesetval->nodeTab)->parent;
          std::__cxx11::string::~string(local_350);
          std::__cxx11::string::~string(local_328);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                   in_stack_fffffffffffff7f0);
        pxVar8 = FindChild((ParserProbModelXML *)
                           CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                           (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::~allocator(&local_431);
        if (pxVar8 != (xmlNodePtr)0x0) {
          xmlGetProp(pxVar8,"type");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                     in_stack_fffffffffffff7f0);
          std::allocator<char>::~allocator(&local_459);
          bVar1 = std::operator==(in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8);
          if (bVar1) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)in_stack_fffffffffffff7c0,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)in_stack_fffffffffffff7b8);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)in_stack_fffffffffffff7c0,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)in_stack_fffffffffffff7b8);
            local_8 = QueryADD(in_RSI,in_RDX,in_RCX,in_R8,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)pxVar4);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)0xa87dbb);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)0xa87dc8);
            local_4c4 = 1;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8);
            if (bVar1) {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     *)in_stack_fffffffffffff7c0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     *)in_stack_fffffffffffff7b8);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     *)in_stack_fffffffffffff7c0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     *)in_stack_fffffffffffff7b8);
              local_8 = QueryTable(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                    *)pxVar8);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                      *)0xa87f51);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                      *)0xa87f5e);
              local_4c4 = 1;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8);
              if (!bVar1) {
                __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x28);
                std::operator+((char *)in_stack_fffffffffffff808,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800);
                std::operator+(__lhs,(char *)in_stack_fffffffffffff7c0);
                EParse::EParse((EParse *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
                __cxa_throw(__lhs,&EParse::typeinfo,EParse::~EParse);
              }
              std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
              ::_Rb_tree_const_iterator(local_530);
              this_01 = (ParserProbModelXML *)local_559;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pxVar8
                         ,(char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
              pxVar4 = FindChild((ParserProbModelXML *)
                                 CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                 (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
              __a = &local_581;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pxVar8
                         ,(char *)pxVar4,__a);
              pxVar4 = FindChild((ParserProbModelXML *)
                                 CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                                 (xmlNodePtr)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
              std::__cxx11::string::~string(local_580);
              std::allocator<char>::~allocator(&local_581);
              std::__cxx11::string::~string((string *)(local_559 + 1));
              auVar13._0_8_ = std::allocator<char>::~allocator((allocator<char> *)local_559);
              auVar13._8_56_ = extraout_var;
              auVar12 = auVar13._0_16_;
              local_538 = pxVar4;
              GetVariableName_abi_cxx11_(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
              iVar3 = GetVariableTimeslice(this_01,pxVar8);
              if (iVar3 == 0) {
                local_530[0]._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffff7b8,(key_type *)0xa8813d);
              }
              else {
                local_530[0]._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffff7b8,(key_type *)0xa88230);
              }
              ppVar6 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                       ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                                     *)0xa88261);
              auVar12 = vcvtusi2ss_avx512f(auVar12,(ppVar6->second).second);
              local_8 = 1.0 / (double)auVar12._0_4_;
              local_4c4 = 1;
              std::__cxx11::string::~string(local_5a8);
            }
          }
          std::__cxx11::string::~string(local_458);
          std::__cxx11::string::~string(local_198);
          std::__cxx11::string::~string(local_90);
          return local_8;
        }
      }
    }
    local_278 = local_278->next;
  } while( true );
}

Assistant:

double ParserProbModelXML::QueryADD(const xmlNodePtr root_node,
                                    const xmlNodePtr current_node,
                                    const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                    const std::map<std::string, std::pair<Index, Index> > t1_deps)
{
    //find top variable
    xmlNodePtr top = FindChild(current_node, "TopVariable");
    if(top == NULL)
        throw EParse("Incorrectly specified Tree/ADD (no top variable).");
   
    string top_name = GetVariableName(top);
    int timeslice = GetVariableTimeslice(top);    
    
    map<string, pair<Index, Index> >::const_iterator it;
    if(timeslice == 0){ 
        it = t0_deps.find(top_name);
        if(it == t0_deps.end())
        {
            throw EParse("Top variable " + top_name + " not present in dependencies.");
        }
    }
    else
    {
        it = t1_deps.find(top_name);
        if(it == t1_deps.end())
        {
            throw EParse("Top variable " + top_name + " not present in dependencies.");
        }
    }

    Index value = it->second.first; //the (integer) value of the requested top variable
    std::pair<elm_type, Index> elm = GetParsedElement(top_name);
    string value_name;
    switch(elm.first)
    {
    case STATE:
        value_name = _m_fDecPOMDP->GetStateFactorDiscrete(elm.second)->GetStateFactorValue(value);
        break;
    case ACTION:
        if(!_m_asynchronousModel)
            value_name = _m_fDecPOMDP->GetAction(elm.second, value)->GetName();
        else
            value_name = _m_ANames[elm.second][value];
        break;
    case OBSERVATION:
        value_name = _m_fDecPOMDP->GetObservation(elm.second, value)->GetName();
        break;
    default:
        throw EParse("Variable " + top_name + " has unrecognized dependencies.");
        break;
    }
    xmlNodePtr branch_set = FindChild(current_node, "Branches");
    if(branch_set == NULL)
        throw EParse("Incorrectly specified Tree/ADD (no branches).");

    xmlNodePtr branch = xmlFirstElementChild(branch_set);
    bool found_branch = false;
    while(branch != NULL && !found_branch)
    {
        if(branch->type == XML_ELEMENT_NODE)
        {
            xmlNodePtr states = FindChild(branch, "States");
            if(xmlChildElementCount(states) == 0)
            {
                found_branch = true;
            }
            else
            {
                xmlNodePtr var_state = xmlFirstElementChild(states);
                while(var_state != NULL && !found_branch)
                {
                    if(var_state->type == XML_ELEMENT_NODE)
                    {
                        string var_name = GetVariableName(var_state);
                        if(value_name == var_name)
                        {
                            found_branch = true;
                        }
                    }
                    var_state = var_state->next;
                }
            }
            if(found_branch)
            {
                //Check if it is a reference to another branch
                xmlNodePtr reference = FindChild(branch, "Reference");
                if(reference != NULL)
                {
                    string ref_name((char*) xmlNodeListGetString(GetDoc(), reference->xmlChildrenNode, 1));
                    string xpath_str = ".//Branch/Label[contains(.,'"+ref_name+"')]";
                    xmlXPathObjectPtr label_nodes = GetNodesMatchingExpression((xmlChar*) xpath_str.c_str(),root_node);                    
                    if(label_nodes == NULL)
                    {
                        throw EParse("Label \"" + ref_name + "\" not found.");
                    }
                    else if(label_nodes->nodesetval->nodeNr > 1)
                    {
                        throw EParse("Label \"" + ref_name + "\" defined multiple times.");
                    }
                    branch = label_nodes->nodesetval->nodeTab[0]->parent;
                }
                
                xmlNodePtr potential = FindChild(branch, "Potential");
                if(potential != NULL)
                {
                    string CPD_type = (char*) xmlGetProp(potential, (xmlChar*) "type");
                    if(CPD_type == "Tree/ADD")
                    {
                        return QueryADD(root_node, potential, t0_deps, t1_deps);
                    }
                    else if(CPD_type == "Table")
                    {
                        return QueryTable(potential, t0_deps, t1_deps);
                    }
                    else if(CPD_type == "Uniform")
                    {
                        map<string, pair<Index, Index> >::const_iterator it;
                        xmlNodePtr dep_var = FindChild(FindChild(potential, "Variables"), "Variable");
                        string dep_var_name = GetVariableName(dep_var);
                        int dep_var_time = GetVariableTimeslice(dep_var);
                        if(dep_var_time == 0)
                        {
                            it = t0_deps.find(dep_var_name);
                        }
                        else
                        {
                            it = t1_deps.find(dep_var_name);
                        }
                        return 1.0/(float) it->second.second;
                    }
                    else
                    {
                        throw EParse("CPD type \"" + CPD_type + "\" not supported.");
                    }
                }
            }
        }
        branch = branch->next;
    }

    throw EParse("Probability under top variable " + top_name + " not found.");
}